

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O2

void If_ManSetupCiCutSets(If_Man_t *p)

{
  void *pvVar1;
  If_Set_t *pIVar2;
  undefined2 *puVar3;
  int i;
  long lVar4;
  int iVar5;
  Vec_Ptr_t *p_00;
  long lVar6;
  
  if (p->pMemCi == (If_Set_t *)0x0) {
    i = 0;
    while( true ) {
      p_00 = p->vCis;
      iVar5 = p_00->nSize;
      if (iVar5 <= i) break;
      pvVar1 = Vec_PtrEntry(p_00,i);
      If_ManSetupCutTriv(p,(If_Cut_t *)((long)pvVar1 + 0x50),*(int *)((long)pvVar1 + 4));
      i = i + 1;
    }
    pIVar2 = (If_Set_t *)malloc((long)p->nObjs[2] << 5);
    p->pMemCi = pIVar2;
    lVar4 = 0;
    for (lVar6 = 0; lVar6 < iVar5; lVar6 = lVar6 + 1) {
      pvVar1 = Vec_PtrEntry(p_00,(int)lVar6);
      pIVar2 = p->pMemCi;
      *(long *)((long)pvVar1 + 0x48) = (long)&pIVar2->nCutsMax + lVar4;
      puVar3 = (undefined2 *)((long)&pIVar2->nCutsMax + lVar4);
      puVar3[1] = 1;
      *puVar3 = (short)p->pPars->nCutsMax;
      *(undefined2 **)(puVar3 + 8) = puVar3 + 0xc;
      *(long *)(puVar3 + 0xc) = (long)pvVar1 + 0x50;
      p_00 = p->vCis;
      iVar5 = p_00->nSize;
      lVar4 = lVar4 + 0x20;
    }
    return;
  }
  __assert_fail("p->pMemCi == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMan.c"
                ,0x238,"void If_ManSetupCiCutSets(If_Man_t *)");
}

Assistant:

void If_ManSetupCiCutSets( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i;
    assert( p->pMemCi == NULL );
    // create elementary cuts for the CIs
    If_ManForEachCi( p, pObj, i )
        If_ManSetupCutTriv( p, &pObj->CutBest, pObj->Id );
    // create elementary cutsets for the CIs
    p->pMemCi = (If_Set_t *)ABC_ALLOC( char, If_ManCiNum(p) * (sizeof(If_Set_t) + sizeof(void *)) );
    If_ManForEachCi( p, pObj, i )
    {
        pObj->pCutSet = (If_Set_t *)((char *)p->pMemCi + i * (sizeof(If_Set_t) + sizeof(void *)));
        pObj->pCutSet->nCuts = 1;
        pObj->pCutSet->nCutsMax = p->pPars->nCutsMax;
        pObj->pCutSet->ppCuts = (If_Cut_t **)(pObj->pCutSet + 1);
        pObj->pCutSet->ppCuts[0] = &pObj->CutBest;
    }
}